

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.hpp
# Opt level: O0

void __thiscall
Diligent::VulkanDynamicHeap::VulkanDynamicHeap
          (VulkanDynamicHeap *this,VulkanDynamicMemoryManager *DynamicMemMgr,string *HeapName,
          Uint32 PageSize)

{
  Uint32 PageSize_local;
  string *HeapName_local;
  VulkanDynamicMemoryManager *DynamicMemMgr_local;
  VulkanDynamicHeap *this_local;
  
  this->m_GlobalDynamicMemMgr = DynamicMemMgr;
  std::__cxx11::string::string((string *)&this->m_HeapName,(string *)HeapName);
  std::
  vector<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
  ::vector(&this->m_MasterBlocks);
  this->m_CurrOffset = 0xffffffffffffffff;
  this->m_MasterBlockSize = PageSize;
  this->m_AvailableSize = 0;
  this->m_CurrAlignedSize = 0;
  this->m_CurrUsedSize = 0;
  this->m_PeakAlignedSize = 0;
  this->m_PeakUsedSize = 0;
  this->m_CurrAllocatedSize = 0;
  this->m_PeakAllocatedSize = 0;
  return;
}

Assistant:

VulkanDynamicHeap(VulkanDynamicMemoryManager& DynamicMemMgr, std::string HeapName, Uint32 PageSize) :
        m_GlobalDynamicMemMgr{DynamicMemMgr},
        m_HeapName           {std::move(HeapName)},
        m_MasterBlockSize    (PageSize)
    {}